

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O1

D_Scope * new_D_Scope(D_Scope *parent)

{
  D_Scope *pDVar1;
  D_SymHash *pDVar2;
  D_Sym **__s;
  
  pDVar1 = (D_Scope *)malloc(0x50);
  *(undefined8 *)pDVar1 = 0;
  pDVar1->ll = (D_Sym *)0x0;
  pDVar1->hash = (D_SymHash *)0x0;
  pDVar1->updates = (D_Sym *)0x0;
  pDVar1->search = (D_Scope *)0x0;
  pDVar1->dynamic = (D_Scope *)0x0;
  pDVar1->up = (D_Scope *)0x0;
  pDVar1->up_updates = (D_Scope *)0x0;
  pDVar1->down = (D_Scope *)0x0;
  pDVar1->down_next = (D_Scope *)0x0;
  if (parent == (D_Scope *)0x0) {
    pDVar2 = (D_SymHash *)malloc(0x30);
    pDVar2->index = 0;
    pDVar2->grow = 0;
    (pDVar2->syms).n = 0;
    (pDVar2->syms).i = 0;
    (pDVar2->syms).v = (D_Sym **)0x0;
    (pDVar2->syms).e[0] = (D_Sym *)0x0;
    (pDVar2->syms).e[1] = (D_Sym *)0x0;
    (pDVar2->syms).e[2] = (D_Sym *)0x0;
    pDVar2->grow = 0x1883;
    (pDVar2->syms).n = 0xc41;
    __s = (D_Sym **)malloc(0x6208);
    (pDVar2->syms).v = __s;
    memset(__s,0,0x6208);
    pDVar1->hash = pDVar2;
  }
  else {
    pDVar1->depth = parent->depth + 1;
    *(byte *)pDVar1 = *(byte *)pDVar1 & 0xfc | *(byte *)parent & 3;
    pDVar1->search = parent;
    pDVar1->up = parent;
    pDVar1->up_updates = parent;
    pDVar1->down_next = parent->down;
    parent->down = pDVar1;
  }
  return pDVar1;
}

Assistant:

D_Scope *new_D_Scope(D_Scope *parent) {
  D_Scope *st = MALLOC(sizeof(D_Scope));
  memset(st, 0, sizeof(D_Scope));
  if (parent) {
    st->depth = parent->depth + 1;
    st->kind = parent->kind;
    st->search = parent;
    st->up = parent;
    st->up_updates = parent;
    st->down_next = parent->down;
    parent->down = st;
  } else
    st->hash = new_D_SymHash();
  return st;
}